

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O3

void Sbc_ManAddInternalToPath(Gia_Man_t *p,Vec_Bit_t *vPath)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  iVar3 = p->nObjs;
  if (1 < iVar3) {
    uVar7 = 1;
    do {
      if ((long)p->vMapping->nSize <= (long)uVar7) {
LAB_0054ed45:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vMapping->pArray[uVar7] != 0) {
        if ((long)vPath->nSize <= (long)uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)vPath->pArray[uVar7 >> 5 & 0x7ffffff] >> ((uint)uVar7 & 0x1f) & 1) != 0) {
          Gia_ManIncrementTravId(p);
          pVVar1 = p->vMapping;
          lVar5 = (long)pVVar1->nSize;
          if (lVar5 <= (long)uVar7) goto LAB_0054ed45;
          piVar2 = pVVar1->pArray;
          lVar4 = 0;
          while( true ) {
            lVar6 = (long)piVar2[uVar7];
            if ((lVar6 < 0) || ((uint)lVar5 <= (uint)piVar2[uVar7])) goto LAB_0054ed45;
            if (piVar2[lVar6] <= lVar4) break;
            if (p->nTravIdsAlloc <= piVar2[lVar6 + lVar4 + 1]) {
              __assert_fail("Id < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
            }
            p->pTravIds[piVar2[lVar6 + lVar4 + 1]] = p->nTravIds;
            lVar4 = lVar4 + 1;
            lVar5 = (long)pVVar1->nSize;
            if (lVar5 <= (long)uVar7) goto LAB_0054ed45;
          }
          Sbc_ManAddInternalToPath_rec(p,(uint)uVar7,vPath);
          iVar3 = p->nObjs;
        }
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)iVar3);
  }
  return;
}

Assistant:

void Sbc_ManAddInternalToPath( Gia_Man_t * p, Vec_Bit_t * vPath )
{
    int k, iFan, iObj;
    Gia_ManForEachLut( p, iObj )
    {
        if ( !Vec_BitEntry(vPath, iObj) )
            continue;
        Gia_ManIncrementTravId( p );
        Gia_LutForEachFanin( p, iObj, iFan, k )
            Gia_ObjSetTravIdCurrentId(p, iFan);
        Sbc_ManAddInternalToPath_rec( p, iObj, vPath );
    }
}